

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O2

size_t tt::detail::convert<unsigned_long>(char *buf,unsigned_long value)

{
  bool bVar1;
  unsigned_long uVar2;
  char *pcVar3;
  char *pcVar4;
  
  uVar2 = value;
  pcVar4 = buf;
  do {
    pcVar3 = pcVar4;
    *pcVar3 = *(char *)(zero + uVar2 % 10);
    pcVar4 = pcVar3 + 1;
    bVar1 = 9 < uVar2;
    uVar2 = uVar2 / 10;
  } while (bVar1);
  if (value != 0) {
    *pcVar4 = '-';
    pcVar4 = pcVar3 + 2;
  }
  *pcVar4 = '\0';
  std::__reverse<char*>(buf,pcVar4);
  return (long)pcVar4 - (long)buf;
}

Assistant:

size_t convert(char buf[],T value){ //将数值转换为字符串
	T i = value;
	char* p = buf;

	do{
		int lsd = static_cast<int>(i % 10);
		i /= 10;
		*p++ = zero[lsd];
		
	}while(i != 0);

	if(value << 0){
		*p++ = '-';
	}

	*p = '\0';

	std::reverse(buf,p);

	return p - buf;
}